

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

If * __thiscall
wasm::Builder::makeIf(Builder *this,Expression *condition,Expression *ifTrue,Expression *ifFalse)

{
  If *pIVar1;
  If *ret;
  Expression *ifFalse_local;
  Expression *ifTrue_local;
  Expression *condition_local;
  Builder *this_local;
  
  pIVar1 = MixedArena::alloc<wasm::If>((MixedArena *)(this->wasm + 0x158));
  pIVar1->condition = condition;
  pIVar1->ifTrue = ifTrue;
  pIVar1->ifFalse = ifFalse;
  wasm::If::finalize();
  return pIVar1;
}

Assistant:

If* makeIf(Expression* condition,
             Expression* ifTrue,
             Expression* ifFalse = nullptr) {
    auto* ret = wasm.allocator.alloc<If>();
    ret->condition = condition;
    ret->ifTrue = ifTrue;
    ret->ifFalse = ifFalse;
    ret->finalize();
    return ret;
  }